

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlDocPtr xmlCopyDoc(xmlDocPtr doc,int recursive)

{
  xmlDocPtr doc_00;
  char *pcVar1;
  xmlChar *pxVar2;
  xmlDtdPtr pxVar3;
  xmlNsPtr pxVar4;
  xmlNodePtr pxVar5;
  _xmlNode *local_30;
  xmlNodePtr tmp;
  xmlDocPtr ret;
  int recursive_local;
  xmlDocPtr doc_local;
  
  if (doc == (xmlDocPtr)0x0) {
    return (xmlDocPtr)0x0;
  }
  doc_00 = xmlNewDoc(doc->version);
  if (doc_00 == (xmlDocPtr)0x0) {
    return (xmlDocPtr)0x0;
  }
  doc_00->type = doc->type;
  if (doc->name != (char *)0x0) {
    pcVar1 = (*xmlMemStrdup)(doc->name);
    doc_00->name = pcVar1;
    if (doc_00->name == (char *)0x0) goto LAB_00166294;
  }
  if (doc->encoding != (xmlChar *)0x0) {
    pxVar2 = xmlStrdup(doc->encoding);
    doc_00->encoding = pxVar2;
    if (doc_00->encoding == (xmlChar *)0x0) goto LAB_00166294;
  }
  if (doc->URL != (xmlChar *)0x0) {
    pxVar2 = xmlStrdup(doc->URL);
    doc_00->URL = pxVar2;
    if (doc_00->URL == (xmlChar *)0x0) goto LAB_00166294;
  }
  doc_00->charset = doc->charset;
  doc_00->compression = doc->compression;
  doc_00->standalone = doc->standalone;
  if (recursive == 0) {
    return doc_00;
  }
  doc_00->last = (_xmlNode *)0x0;
  doc_00->children = (_xmlNode *)0x0;
  if (doc->intSubset != (_xmlDtd *)0x0) {
    pxVar3 = xmlCopyDtd(doc->intSubset);
    doc_00->intSubset = pxVar3;
    if (doc_00->intSubset == (_xmlDtd *)0x0) goto LAB_00166294;
    xmlSetTreeDoc((xmlNodePtr)doc_00->intSubset,doc_00);
  }
  if (doc->oldNs != (_xmlNs *)0x0) {
    pxVar4 = xmlCopyNamespaceList(doc->oldNs);
    doc_00->oldNs = pxVar4;
    if (doc_00->oldNs == (_xmlNs *)0x0) goto LAB_00166294;
  }
  if (doc->children == (_xmlNode *)0x0) {
    return doc_00;
  }
  pxVar5 = xmlStaticCopyNodeList(doc->children,doc_00,(xmlNodePtr)doc_00);
  doc_00->children = pxVar5;
  if (doc_00->children != (_xmlNode *)0x0) {
    doc_00->last = (_xmlNode *)0x0;
    for (local_30 = doc_00->children; local_30 != (_xmlNode *)0x0; local_30 = local_30->next) {
      if (local_30->next == (_xmlNode *)0x0) {
        doc_00->last = local_30;
      }
    }
    return doc_00;
  }
LAB_00166294:
  xmlFreeDoc(doc_00);
  return (xmlDocPtr)0x0;
}

Assistant:

xmlDocPtr
xmlCopyDoc(xmlDocPtr doc, int recursive) {
    xmlDocPtr ret;

    if (doc == NULL) return(NULL);
    ret = xmlNewDoc(doc->version);
    if (ret == NULL) return(NULL);
    ret->type = doc->type;
    if (doc->name != NULL) {
        ret->name = xmlMemStrdup(doc->name);
        if (ret->name == NULL)
            goto error;
    }
    if (doc->encoding != NULL) {
        ret->encoding = xmlStrdup(doc->encoding);
        if (ret->encoding == NULL)
            goto error;
    }
    if (doc->URL != NULL) {
        ret->URL = xmlStrdup(doc->URL);
        if (ret->URL == NULL)
            goto error;
    }
    ret->charset = doc->charset;
    ret->compression = doc->compression;
    ret->standalone = doc->standalone;
    if (!recursive) return(ret);

    ret->last = NULL;
    ret->children = NULL;
    if (doc->intSubset != NULL) {
        ret->intSubset = xmlCopyDtd(doc->intSubset);
	if (ret->intSubset == NULL)
            goto error;
        /* Can't fail on DTD */
	xmlSetTreeDoc((xmlNodePtr)ret->intSubset, ret);
    }
    if (doc->oldNs != NULL) {
        ret->oldNs = xmlCopyNamespaceList(doc->oldNs);
        if (ret->oldNs == NULL)
            goto error;
    }
    if (doc->children != NULL) {
	xmlNodePtr tmp;

	ret->children = xmlStaticCopyNodeList(doc->children, ret,
		                               (xmlNodePtr)ret);
        if (ret->children == NULL)
            goto error;
	ret->last = NULL;
	tmp = ret->children;
	while (tmp != NULL) {
	    if (tmp->next == NULL)
	        ret->last = tmp;
	    tmp = tmp->next;
	}
    }
    return(ret);

error:
    xmlFreeDoc(ret);
    return(NULL);
}